

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O0

ObjectData * __thiscall
deqp::gles3::Performance::anon_unknown_0::OccluderDynamicFragDepthCostCase::genOccluderGeometry
          (ObjectData *__return_storage_ptr__,OccluderDynamicFragDepthCostCase *this)

{
  string local_38;
  OccluderDynamicFragDepthCostCase *local_18;
  OccluderDynamicFragDepthCostCase *this_local;
  
  local_18 = this;
  this_local = (OccluderDynamicFragDepthCostCase *)__return_storage_ptr__;
  Performance::(anonymous_namespace)::Utils::getDynamicFragDepthFragmentShader_abi_cxx11_();
  Utils::quadWith(__return_storage_ptr__,&local_38,0.2);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

virtual ObjectData	genOccluderGeometry					(void) const { return Utils::quadWith(Utils::getDynamicFragDepthFragmentShader(), 0.2f); }